

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O1

bool __thiscall
gl3cts::PerVertexValidationTest::runSeparateShaderTestMode
          (PerVertexValidationTest *this,_test_iteration iteration)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostringstream *poVar2;
  _shader_stage shader_stage;
  string *psVar3;
  GLuint *pGVar4;
  bool bVar5;
  ContextType context_type;
  int iVar6;
  GLuint GVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  ulong uVar10;
  GLenum *pGVar11;
  bool bVar12;
  ulong uVar13;
  char *this_00;
  string local_3b0;
  _shader_stage used_shader_stages;
  ContextType min_context_type;
  GLint link_status;
  GLint compile_status;
  ulong local_380;
  char *body_raw_ptr;
  long local_370;
  long local_368 [2];
  string fs_body;
  string vs_body;
  string te_body;
  string tc_body;
  string gs_body;
  long *local_2b8;
  long local_2b0;
  long local_2a8 [2];
  long *local_298;
  long local_290;
  long local_288 [2];
  long *local_278;
  long local_270;
  long local_268 [2];
  _shader shaders [5];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar9;
  
  context_type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  min_context_type.super_ApiType.m_bits = (ApiType)0x300;
  fs_body._M_dataplus._M_p = (pointer)&fs_body.field_2;
  fs_body._M_string_length = 0;
  fs_body.field_2._M_local_buf[0] = '\0';
  gs_body._M_dataplus._M_p = (pointer)&gs_body.field_2;
  gs_body._M_string_length = 0;
  gs_body.field_2._M_local_buf[0] = '\0';
  tc_body._M_dataplus._M_p = (pointer)&tc_body.field_2;
  tc_body._M_string_length = 0;
  tc_body.field_2._M_local_buf[0] = '\0';
  te_body._M_dataplus._M_p = (pointer)&te_body.field_2;
  te_body._M_string_length = 0;
  te_body.field_2._M_local_buf[0] = '\0';
  vs_body._M_dataplus._M_p = (pointer)&vs_body.field_2;
  vs_body._M_string_length = 0;
  vs_body.field_2._M_local_buf[0] = '\0';
  shaders[0].body_ptr = &fs_body;
  shaders[0].so_id_ptr = &this->m_fs_id;
  shaders[0].shader_stage = SHADER_STAGE_FRAGMENT;
  shaders[0].shader_stage_bit_gl = 2;
  shaders[0].shader_stage_gl = 0x8b30;
  shaders[1].body_ptr = &gs_body;
  shaders[1].so_id_ptr = &this->m_gs_id;
  shaders[1].shader_stage = SHADER_STAGE_GEOMETRY;
  shaders[1].shader_stage_bit_gl = 4;
  shaders[1].shader_stage_gl = 0x8dd9;
  shaders[2].body_ptr = &tc_body;
  shaders[2].so_id_ptr = &this->m_tc_id;
  shaders[2].shader_stage = SHADER_STAGE_TESSELLATION_CONTROL;
  shaders[2].shader_stage_bit_gl = 8;
  shaders[2].shader_stage_gl = 0x8e88;
  shaders[3].body_ptr = &te_body;
  shaders[3].so_id_ptr = &this->m_te_id;
  shaders[3].shader_stage = SHADER_STAGE_TESSELLATION_EVALUATION;
  shaders[3].shader_stage_bit_gl = 0x10;
  shaders[3].shader_stage_gl = 0x8e87;
  shaders[4].body_ptr = &vs_body;
  shaders[4].so_id_ptr = &this->m_vs_id;
  shaders[4].shader_stage = SHADER_STAGE_VERTEX;
  shaders[4].shader_stage_bit_gl = 1;
  shaders[4].shader_stage_gl = 0x8b31;
  getTestIterationProperties
            (this,context_type,iteration,&min_context_type,&used_shader_stages,shaders[1].body_ptr,
             shaders[2].body_ptr,shaders[3].body_ptr,shaders[4].body_ptr);
  bVar5 = glu::contextSupports(context_type,min_context_type.super_ApiType.m_bits & 0x3ff);
  bVar12 = true;
  if (bVar5) {
    GVar7 = (**(code **)(lVar9 + 0x3c8))();
    this->m_vs_po_id = GVar7;
    dVar8 = (**(code **)(lVar9 + 0x800))();
    uVar10 = 0xaec;
    glu::checkError(dVar8,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0xaec);
    pGVar11 = &shaders[0].shader_stage_gl;
    uVar13 = 0;
    local_380 = 0;
    do {
      body_raw_ptr = (char *)0x0;
      shader_stage = pGVar11[-2];
      if ((used_shader_stages & shader_stage) != 0) {
        psVar3 = ((_shader *)(pGVar11 + -6))->body_ptr;
        pGVar4 = *(GLuint **)(pGVar11 + -4);
        body_raw_ptr = (psVar3->_M_dataplus)._M_p;
        GVar7 = (**(code **)(lVar9 + 0x3f0))(*pGVar11);
        *pGVar4 = GVar7;
        dVar8 = (**(code **)(lVar9 + 0x800))();
        glu::checkError(dVar8,"glCreateShader() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                        ,0xafb);
        (**(code **)(lVar9 + 0x12b8))(*pGVar4,1,&body_raw_ptr,0);
        dVar8 = (**(code **)(lVar9 + 0x800))();
        glu::checkError(dVar8,"glShaderSource() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                        ,0xaff);
        (**(code **)(lVar9 + 0x248))(*pGVar4);
        dVar8 = (**(code **)(lVar9 + 0x800))();
        glu::checkError(dVar8,"glCompileShader() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                        ,0xb04);
        (**(code **)(lVar9 + 0xa70))(*pGVar4,0x8b81,&compile_status);
        dVar8 = (**(code **)(lVar9 + 0x800))();
        this_00 = "glGetShaderiv() call failed.";
        glu::checkError(dVar8,"glGetShaderiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                        ,0xb07);
        if (compile_status != 1) {
          local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar2 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar2);
          getShaderStageName_abi_cxx11_(&local_3b0,(PerVertexValidationTest *)this_00,shader_stage);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,local_3b0._M_dataplus._M_p,local_3b0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2," unexpectedly failed to compile.\n\nBody:\n>>\n",0x2b);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar2,(psVar3->_M_dataplus)._M_p,psVar3->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n<<\n",4);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
            operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream(poVar2);
          std::ios_base::~ios_base(local_138);
          if ((local_380 & 1) == 0) goto LAB_00a8f6ef;
          break;
        }
        (**(code **)(lVar9 + 0x10))(this->m_vs_po_id,*pGVar4);
        dVar8 = (**(code **)(lVar9 + 0x800))();
        uVar10 = 0xb16;
        glu::checkError(dVar8,"glAttachShader() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                        ,0xb16);
      }
      bVar5 = 3 < uVar13;
      uVar13 = uVar13 + 1;
      uVar10 = CONCAT71((int7)(uVar10 >> 8),bVar5);
      pGVar11 = pGVar11 + 8;
      local_380 = uVar10;
    } while (uVar13 != 5);
    (**(code **)(lVar9 + 0x1058))(this->m_vs_po_id,0x8258,1);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glProgramParameteri() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0xb1c);
    (**(code **)(lVar9 + 0xce8))(this->m_vs_po_id);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glLinkProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0xb20);
    (**(code **)(lVar9 + 0x9d8))(this->m_vs_po_id,0x8b82,&link_status);
    dVar8 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar8,"glGetProgramiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0xb23);
    bVar12 = true;
    if (link_status == 1) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar2 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,
                 "Separable program, consisting of the following separate shaders, was linked successfully, despite incompatible or missing gl_PerVertex block re-declarations.\n\nFragment shader program:\n>>\n"
                 ,0xbb);
      paVar1 = &local_3b0.field_2;
      local_3b0._M_dataplus._M_p = (pointer)paVar1;
      if (fs_body._M_string_length == 0) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"[not used]","");
      }
      else {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3b0,fs_body._M_dataplus._M_p,
                   fs_body._M_dataplus._M_p + fs_body._M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,local_3b0._M_dataplus._M_p,local_3b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"\n<<\nGeometry shader program:\n>>\n",0x20);
      body_raw_ptr = (char *)local_368;
      if (gs_body._M_string_length == 0) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&body_raw_ptr,"[not used]","");
      }
      else {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&body_raw_ptr,gs_body._M_dataplus._M_p,
                   gs_body._M_dataplus._M_p + gs_body._M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,body_raw_ptr,local_370);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"\n<<\nTessellation control shader program:\n>>\n",0x2c);
      local_278 = local_268;
      if (tc_body._M_string_length == 0) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"[not used]","");
      }
      else {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,tc_body._M_dataplus._M_p,
                   tc_body._M_dataplus._M_p + tc_body._M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,(char *)local_278,local_270);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"\n<<\nTessellation evaluation shader program:\n>>\n",0x2f);
      local_298 = local_288;
      if (te_body._M_string_length == 0) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"[not used]","");
      }
      else {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,te_body._M_dataplus._M_p,
                   te_body._M_dataplus._M_p + te_body._M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,(char *)local_298,local_290);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,"\n<<\nVertex shader program:\n>>\n",0x1e);
      local_2b8 = local_2a8;
      if (vs_body._M_string_length == 0) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"[not used]","");
      }
      else {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b8,vs_body._M_dataplus._M_p,
                   vs_body._M_dataplus._M_p + vs_body._M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar2,(char *)local_2b8,local_2b0);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8,local_2a8[0] + 1);
      }
      if (local_298 != local_288) {
        operator_delete(local_298,local_288[0] + 1);
      }
      if (local_278 != local_268) {
        operator_delete(local_278,local_268[0] + 1);
      }
      if ((long *)body_raw_ptr != local_368) {
        operator_delete(body_raw_ptr,local_368[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      std::ios_base::~ios_base(local_138);
LAB_00a8f6ef:
      bVar12 = false;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vs_body._M_dataplus._M_p != &vs_body.field_2) {
    operator_delete(vs_body._M_dataplus._M_p,
                    CONCAT71(vs_body.field_2._M_allocated_capacity._1_7_,
                             vs_body.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)te_body._M_dataplus._M_p != &te_body.field_2) {
    operator_delete(te_body._M_dataplus._M_p,
                    CONCAT71(te_body.field_2._M_allocated_capacity._1_7_,
                             te_body.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tc_body._M_dataplus._M_p != &tc_body.field_2) {
    operator_delete(tc_body._M_dataplus._M_p,
                    CONCAT71(tc_body.field_2._M_allocated_capacity._1_7_,
                             tc_body.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gs_body._M_dataplus._M_p != &gs_body.field_2) {
    operator_delete(gs_body._M_dataplus._M_p,
                    CONCAT71(gs_body.field_2._M_allocated_capacity._1_7_,
                             gs_body.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fs_body._M_dataplus._M_p != &fs_body.field_2) {
    operator_delete(fs_body._M_dataplus._M_p,
                    CONCAT71(fs_body.field_2._M_allocated_capacity._1_7_,
                             fs_body.field_2._M_local_buf[0]) + 1);
  }
  return bVar12;
}

Assistant:

bool PerVertexValidationTest::runSeparateShaderTestMode(_test_iteration iteration)
{
	glw::GLint			  compile_status;
	glu::ContextType	  context_type = m_context.getRenderContext().getType();
	const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();
	glw::GLint			  link_status;
	glu::ContextType	  min_context_type;
	bool				  result = false;
	_shader_stage		  used_shader_stages;

	std::string fs_body;
	std::string gs_body;
	std::string tc_body;
	std::string te_body;
	std::string vs_body;

	struct _shader
	{
		std::string*  body_ptr;
		glw::GLuint*  so_id_ptr;
		_shader_stage shader_stage;
		glw::GLenum   shader_stage_bit_gl;
		glw::GLenum   shader_stage_gl;
	} shaders[] = { { &fs_body, &m_fs_id, SHADER_STAGE_FRAGMENT, GL_FRAGMENT_SHADER_BIT, GL_FRAGMENT_SHADER },
					{ &gs_body, &m_gs_id, SHADER_STAGE_GEOMETRY, GL_GEOMETRY_SHADER_BIT, GL_GEOMETRY_SHADER },
					{ &tc_body, &m_tc_id, SHADER_STAGE_TESSELLATION_CONTROL, GL_TESS_CONTROL_SHADER_BIT,
					  GL_TESS_CONTROL_SHADER },
					{ &te_body, &m_te_id, SHADER_STAGE_TESSELLATION_EVALUATION, GL_TESS_EVALUATION_SHADER_BIT,
					  GL_TESS_EVALUATION_SHADER },
					{ &vs_body, &m_vs_id, SHADER_STAGE_VERTEX, GL_VERTEX_SHADER_BIT, GL_VERTEX_SHADER } };
	const unsigned int n_shaders = static_cast<const unsigned int>(sizeof(shaders) / sizeof(shaders[0]));

	/* Retrieve iteration properties */
	getTestIterationProperties(context_type, iteration, &min_context_type, &used_shader_stages, &gs_body, &tc_body,
							   &te_body, &vs_body);

	if (!glu::contextSupports(context_type, min_context_type.getAPI()))
	{
		result = true;

		goto end;
	}

	/* Bake a single shader with separate programs defined for all shader stages defined by the iteration
	 * and see what happens.
	 *
	 * For simplicity, we re-use m_vs_po_id to store the program object ID.
	 */
	m_vs_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	for (unsigned int n_shader = 0; n_shader < n_shaders; ++n_shader)
	{
		const char*			 body_raw_ptr		  = DE_NULL;
		const std::string&   current_body		  = *shaders[n_shader].body_ptr;
		const _shader_stage& current_shader_stage = shaders[n_shader].shader_stage;
		glw::GLuint&		 current_so_id		  = *shaders[n_shader].so_id_ptr;
		const glw::GLenum&   current_so_type_gl   = shaders[n_shader].shader_stage_gl;

		if ((used_shader_stages & current_shader_stage) != 0)
		{
			body_raw_ptr  = current_body.c_str();
			current_so_id = gl.createShader(current_so_type_gl);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

			gl.shaderSource(current_so_id, 1,		 /* count */
							&body_raw_ptr, DE_NULL); /* length */
			GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

			/* Ensure the shader compiled successfully. */
			gl.compileShader(current_so_id);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

			gl.getShaderiv(current_so_id, GL_COMPILE_STATUS, &compile_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

			if (compile_status != GL_TRUE)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << getShaderStageName(current_shader_stage)
								   << " unexpectedly failed to compile.\n"
									  "\nBody:\n>>\n"
								   << current_body << "\n<<\n"
								   << tcu::TestLog::EndMessage;

				goto end;
			}

			/* Attach the shader object to the test program object */
			gl.attachShader(m_vs_po_id, current_so_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");
		} /* if ((used_shader_stages & current_shader_stage) != 0) */
	}	 /* for (all shader objects) */

	/* Mark the program as separable */
	gl.programParameteri(m_vs_po_id, GL_PROGRAM_SEPARABLE, GL_TRUE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glProgramParameteri() call failed.");

	/* Try to link the program and check the result. */
	gl.linkProgram(m_vs_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(m_vs_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status == GL_TRUE)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Separable program, consisting of the following separate shaders, was linked "
							  "successfully, despite incompatible or missing gl_PerVertex block re-declarations.\n"
							  "\n"
							  "Fragment shader program:\n>>\n"
						   << ((fs_body.length() > 0) ? fs_body : "[not used]")
						   << "\n<<\nGeometry shader program:\n>>\n"
						   << ((gs_body.length() > 0) ? gs_body : "[not used]")
						   << "\n<<\nTessellation control shader program:\n>>\n"
						   << ((tc_body.length() > 0) ? tc_body : "[not used]")
						   << "\n<<\nTessellation evaluation shader program:\n>>\n"
						   << ((te_body.length() > 0) ? te_body : "[not used]") << "\n<<\nVertex shader program:\n>>\n"
						   << ((vs_body.length() > 0) ? vs_body : "[not used]") << tcu::TestLog::EndMessage;

		goto end;
	} /* if (link_status == GL_TRUE) */

	/* All done */
	result = true;
end:
	return result;
}